

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O2

void multikey_cache<4u,false>(Cacheblock<4U>_conflict *cache,size_t N,size_t depth)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 uVar4;
  uchar *puVar5;
  uchar *puVar6;
  undefined4 uVar7;
  uint32_t uVar8;
  Cacheblock<4U>_conflict *pCVar9;
  Cacheblock<4U>_conflict *pCVar10;
  Cacheblock<4U>_conflict *pCVar11;
  ulong uVar12;
  size_t N_00;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  Cacheblock<4U>_conflict __tmp;
  
  if (0x1f < N) {
    uVar18 = N >> 3;
    pCVar9 = med3char<Cacheblock<4u>,Cmp>(cache,cache + uVar18,cache + (N >> 2));
    pCVar10 = med3char<Cacheblock<4u>,Cmp>
                        (cache + ((N >> 1) - uVar18),cache + (N >> 1),cache + (N >> 1) + uVar18);
    uVar13 = N - 1;
    pCVar11 = med3char<Cacheblock<4u>,Cmp>
                        (cache + (uVar13 - (N >> 2)),cache + (uVar13 - uVar18),cache + (N - 3));
    pCVar9 = med3char<Cacheblock<4u>,Cmp>(pCVar9,pCVar10,pCVar11);
    uVar8 = cache->cached_bytes;
    uVar7 = *(undefined4 *)&cache->field_0x4;
    puVar5 = cache->ptr;
    uVar2 = *(undefined4 *)&pCVar9->field_0x4;
    puVar6 = pCVar9->ptr;
    cache->cached_bytes = pCVar9->cached_bytes;
    *(undefined4 *)&cache->field_0x4 = uVar2;
    cache->ptr = puVar6;
    pCVar9->cached_bytes = uVar8;
    *(undefined4 *)&pCVar9->field_0x4 = uVar7;
    pCVar9->ptr = puVar5;
    uVar1 = cache->cached_bytes;
    uVar18 = 1;
    uVar12 = uVar13;
    uVar15 = uVar18;
    uVar17 = uVar13;
    do {
      for (pCVar9 = cache + uVar18;
          (uVar18 <= uVar12 && (uVar3 = pCVar9->cached_bytes, uVar1 > uVar3 || uVar3 == uVar1));
          pCVar9 = pCVar9 + 1) {
        uVar16 = uVar15;
        if (uVar1 <= uVar3) {
          uVar16 = uVar15 + 1;
          pCVar10 = cache + uVar15;
          uVar8 = pCVar10->cached_bytes;
          uVar7 = *(undefined4 *)&pCVar10->field_0x4;
          puVar5 = pCVar10->ptr;
          uVar2 = *(undefined4 *)&pCVar9->field_0x4;
          puVar6 = pCVar9->ptr;
          pCVar10 = cache + uVar15;
          pCVar10->cached_bytes = pCVar9->cached_bytes;
          *(undefined4 *)&pCVar10->field_0x4 = uVar2;
          pCVar10->ptr = puVar6;
          pCVar9->cached_bytes = uVar8;
          *(undefined4 *)&pCVar9->field_0x4 = uVar7;
          pCVar9->ptr = puVar5;
        }
        uVar18 = uVar18 + 1;
        uVar15 = uVar16;
      }
      pCVar10 = cache + uVar12;
      while( true ) {
        if (uVar12 < uVar18) {
          uVar13 = uVar13 - uVar17;
          N_00 = uVar17 - uVar12;
          uVar18 = uVar18 - uVar15;
          uVar12 = uVar15;
          if (uVar18 < uVar15) {
            uVar12 = uVar18;
          }
          std::swap_ranges<Cacheblock<4u>*,Cacheblock<4u>*>(cache,cache + uVar12,pCVar9 + -uVar12);
          uVar12 = uVar13;
          if (N_00 < uVar13) {
            uVar12 = N_00;
          }
          std::swap_ranges<Cacheblock<4u>*,Cacheblock<4u>*>
                    (pCVar9,pCVar9 + uVar12,cache + (N - uVar12));
          multikey_cache<4u,false>(cache,uVar18,depth);
          multikey_cache<4u,false>(pCVar9 + ((N - 1) - uVar17),N_00,depth);
          if ((char)uVar1 == '\0') {
            return;
          }
          multikey_cache<4u,true>(pCVar9 + -uVar15,uVar13 + uVar15,depth + 4);
          return;
        }
        if (pCVar10->cached_bytes < uVar1) break;
        uVar16 = uVar17;
        if (pCVar10->cached_bytes == uVar1) {
          uVar16 = uVar17 - 1;
          pCVar11 = cache + uVar17;
          uVar8 = pCVar11->cached_bytes;
          uVar7 = *(undefined4 *)&pCVar11->field_0x4;
          puVar5 = pCVar11->ptr;
          uVar2 = *(undefined4 *)&pCVar10->field_0x4;
          puVar6 = pCVar10->ptr;
          pCVar11 = cache + uVar17;
          pCVar11->cached_bytes = pCVar10->cached_bytes;
          *(undefined4 *)&pCVar11->field_0x4 = uVar2;
          pCVar11->ptr = puVar6;
          pCVar10->cached_bytes = uVar8;
          *(undefined4 *)&pCVar10->field_0x4 = uVar7;
          pCVar10->ptr = puVar5;
        }
        uVar12 = uVar12 - 1;
        pCVar10 = pCVar10 + -1;
        uVar17 = uVar16;
      }
      uVar8 = pCVar9->cached_bytes;
      uVar7 = *(undefined4 *)&pCVar9->field_0x4;
      puVar5 = pCVar9->ptr;
      uVar2 = *(undefined4 *)&pCVar10->field_0x4;
      puVar6 = pCVar10->ptr;
      pCVar9->cached_bytes = pCVar10->cached_bytes;
      *(undefined4 *)&pCVar9->field_0x4 = uVar2;
      pCVar9->ptr = puVar6;
      pCVar10->cached_bytes = uVar8;
      *(undefined4 *)&pCVar10->field_0x4 = uVar7;
      pCVar10->ptr = puVar5;
      uVar18 = uVar18 + 1;
      uVar12 = uVar12 - 1;
    } while( true );
  }
  if (N == 0) {
    return;
  }
  uVar13 = N & 0xffffffff;
  pCVar9 = cache;
  while (1 < (int)uVar13) {
    uVar13 = (ulong)((int)uVar13 - 1);
    uVar1 = pCVar9[1].cached_bytes;
    uVar2 = *(undefined4 *)((long)&pCVar9[1].ptr + 4);
    uVar4 = *(undefined8 *)&pCVar9[1].field_0x4;
    pCVar10 = pCVar9 + 1;
    while ((cache < pCVar10 && (uVar1 < pCVar10[-1].cached_bytes))) {
      pCVar11 = pCVar10 + -1;
      uVar7 = *(undefined4 *)&pCVar11->field_0x4;
      puVar5 = pCVar10[-1].ptr;
      pCVar10->cached_bytes = pCVar11->cached_bytes;
      *(undefined4 *)&pCVar10->field_0x4 = uVar7;
      pCVar10->ptr = puVar5;
      pCVar10 = pCVar11;
    }
    pCVar10->cached_bytes = uVar1;
    *(undefined8 *)&pCVar10->field_0x4 = uVar4;
    *(undefined4 *)((long)&pCVar10->ptr + 4) = uVar2;
    pCVar9 = pCVar9 + 1;
  }
  lVar20 = 0;
  do {
    lVar19 = lVar20;
    pCVar9 = cache + lVar19 + 1;
    lVar14 = -1;
    while( true ) {
      if (lVar19 - N == lVar14) {
        if (lVar14 == 0 || lVar14 == -1) {
          return;
        }
        if ((char)cache[lVar19].cached_bytes == '\0') {
          return;
        }
        insertion_sort<4u>(cache + lVar19,-(int)lVar14,depth + 4);
        return;
      }
      if (pCVar9[-1].cached_bytes != pCVar9->cached_bytes) break;
      lVar14 = lVar14 + -1;
      pCVar9 = pCVar9 + 1;
    }
    lVar20 = lVar19 - lVar14;
    if ((lVar14 != 0 && lVar14 != -1) && ((char)cache[lVar19].cached_bytes != '\0')) {
      insertion_sort<4u>(cache + lVar19,-(int)lVar14,depth + 4);
    }
  } while( true );
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}